

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  DataType samplerDataType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  string shaderSource_09;
  string shaderSource_10;
  string shaderSource_11;
  string shaderSource_12;
  string shaderSource_13;
  string shaderSource_14;
  string shaderSource_15;
  string shaderSource_16;
  string shaderSource_17;
  string shaderSource_18;
  string shaderSource_19;
  string shaderSource_20;
  string shaderSource_21;
  string shaderSource_22;
  string shaderSource_23;
  string shaderSource_24;
  string shaderSource_25;
  string shaderSource_26;
  bool bVar3;
  ContextType ctxType;
  char *__s;
  long *plVar4;
  size_type *psVar5;
  DataType dataType;
  long lVar6;
  string shaderSource;
  DataType in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  _Alloc_hider _Var7;
  size_type sVar8;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 uVar9;
  allocator<char> local_3d9;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
    bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      return;
    }
  }
  _Var7._M_p = &stack0xfffffffffffffc10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc00,"texelFetch: Invalid P type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc00);
  if (_Var7._M_p != &stack0xfffffffffffffc10) {
    operator_delete(_Var7._M_p,in_stack_fffffffffffffc10 + 1);
  }
  lVar6 = 0;
  do {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar6];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_78 = lVar6;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_3d9);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x99df33);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        uVar9 = *psVar5;
        _Var7._M_p = &stack0xfffffffffffffc10;
      }
      else {
        uVar9 = *psVar5;
        _Var7._M_p = (pointer)*plVar4;
      }
      sVar8 = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffc00);
      if (_Var7._M_p != &stack0xfffffffffffffc10) {
        operator_delete(_Var7._M_p,uVar9 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar6 = 0;
      do {
        DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar6);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char*>((string *)local_118,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_00._M_string_length = (size_type)_Var7._M_p;
        shaderSource_00.field_2._M_allocated_capacity = sVar8;
        shaderSource_00.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_118[0],shaderSource_00);
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char*>((string *)local_d8,_Var7._M_p,_Var7._M_p + sVar8);
        shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_01._M_string_length = (size_type)_Var7._M_p;
        shaderSource_01.field_2._M_allocated_capacity = sVar8;
        shaderSource_01.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_d8[0],shaderSource_01);
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_f8[0] = local_e8;
        std::__cxx11::string::_M_construct<char*>((string *)local_f8,_Var7._M_p,_Var7._M_p + sVar8);
        shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_02._M_string_length = (size_type)_Var7._M_p;
        shaderSource_02.field_2._M_allocated_capacity = sVar8;
        shaderSource_02.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_f8[0],shaderSource_02);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        if (lVar6 != 4) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar6);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_03._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_03._M_string_length = (size_type)_Var7._M_p;
          shaderSource_03.field_2._M_allocated_capacity = sVar8;
          shaderSource_03.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_138[0],shaderSource_03);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0],local_128[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_158[0] = local_148;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_158,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_04._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_04._M_string_length = (size_type)_Var7._M_p;
          shaderSource_04.field_2._M_allocated_capacity = sVar8;
          shaderSource_04.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_158[0],shaderSource_04);
          if (local_158[0] != local_148) {
            operator_delete(local_158[0],local_148[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_05._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_05._M_string_length = (size_type)_Var7._M_p;
          shaderSource_05.field_2._M_allocated_capacity = sVar8;
          shaderSource_05.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_98[0],shaderSource_05);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
        }
        DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar6);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char*>((string *)local_178,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_06._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_06._M_string_length = (size_type)_Var7._M_p;
        shaderSource_06.field_2._M_allocated_capacity = sVar8;
        shaderSource_06.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_178[0],shaderSource_06);
        if (local_178[0] != local_168) {
          operator_delete(local_178[0],local_168[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_198[0] = local_188;
        std::__cxx11::string::_M_construct<char*>((string *)local_198,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_07._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_07._M_string_length = (size_type)_Var7._M_p;
        shaderSource_07.field_2._M_allocated_capacity = sVar8;
        shaderSource_07.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_198[0],shaderSource_07);
        if (local_198[0] != local_188) {
          operator_delete(local_198[0],local_188[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_1b8[0] = local_1a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_1b8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_08._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_08._M_string_length = (size_type)_Var7._M_p;
        shaderSource_08.field_2._M_allocated_capacity = sVar8;
        shaderSource_08.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1b8[0],shaderSource_08);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x55,DVar1,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char*>((string *)local_1d8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_09._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_09._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_09._M_string_length = (size_type)_Var7._M_p;
        shaderSource_09.field_2._M_allocated_capacity = sVar8;
        shaderSource_09.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1d8[0],shaderSource_09);
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x56,DVar1,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char*>((string *)local_1f8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_10._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_10._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_10._M_string_length = (size_type)_Var7._M_p;
        shaderSource_10.field_2._M_allocated_capacity = sVar8;
        shaderSource_10.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1f8[0],shaderSource_10);
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x57,DVar1,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char*>((string *)local_218,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_11._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_11._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_11._M_string_length = (size_type)_Var7._M_p;
        shaderSource_11.field_2._M_allocated_capacity = sVar8;
        shaderSource_11.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_218[0],shaderSource_11);
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        if (lVar6 != 0) {
          samplerDataType = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar6);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x55,samplerDataType,TYPE_LAST,
                     in_stack_fffffffffffffbf8);
          local_238[0] = local_228;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_238,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_12._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_12._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_12._M_string_length = (size_type)_Var7._M_p;
          shaderSource_12.field_2._M_allocated_capacity = sVar8;
          shaderSource_12.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_238[0],shaderSource_12);
          if (local_238[0] != local_228) {
            operator_delete(local_238[0],local_228[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x56,samplerDataType,TYPE_LAST,
                     in_stack_fffffffffffffbf8);
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_13._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_13._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_13._M_string_length = (size_type)_Var7._M_p;
          shaderSource_13.field_2._M_allocated_capacity = sVar8;
          shaderSource_13.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_258[0],shaderSource_13);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0],local_248[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x57,samplerDataType,TYPE_LAST,
                     in_stack_fffffffffffffbf8);
          local_278[0] = local_268;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_278,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_14._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_14._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_14._M_string_length = (size_type)_Var7._M_p;
          shaderSource_14.field_2._M_allocated_capacity = sVar8;
          shaderSource_14.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_278[0],shaderSource_14);
          if (local_278[0] != local_268) {
            operator_delete(local_278[0],local_268[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x55,DVar2,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char*>((string *)local_298,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_15._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_15._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_15._M_string_length = (size_type)_Var7._M_p;
        shaderSource_15.field_2._M_allocated_capacity = sVar8;
        shaderSource_15.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_298[0],shaderSource_15);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0],local_288[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x56,DVar2,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_2b8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_16._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_16._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_16._M_string_length = (size_type)_Var7._M_p;
        shaderSource_16.field_2._M_allocated_capacity = sVar8;
        shaderSource_16.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2b8[0],shaderSource_16);
        if (local_2b8[0] != local_2a8) {
          operator_delete(local_2b8[0],local_2a8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x57,DVar2,TYPE_LAST,
                   in_stack_fffffffffffffbf8);
        local_2d8[0] = local_2c8;
        std::__cxx11::string::_M_construct<char*>((string *)local_2d8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_17._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_17._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_17._M_string_length = (size_type)_Var7._M_p;
        shaderSource_17.field_2._M_allocated_capacity = sVar8;
        shaderSource_17.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2d8[0],shaderSource_17);
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0],local_2c8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char*>((string *)local_2f8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_18._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_18._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_18._M_string_length = (size_type)_Var7._M_p;
        shaderSource_18.field_2._M_allocated_capacity = sVar8;
        shaderSource_18.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2f8[0],shaderSource_18);
        if (local_2f8[0] != local_2e8) {
          operator_delete(local_2f8[0],local_2e8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct<char*>((string *)local_318,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_19._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_19._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_19._M_string_length = (size_type)_Var7._M_p;
        shaderSource_19.field_2._M_allocated_capacity = sVar8;
        shaderSource_19.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_318[0],shaderSource_19);
        if (local_318[0] != local_308) {
          operator_delete(local_318[0],local_308[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_338[0] = local_328;
        std::__cxx11::string::_M_construct<char*>((string *)local_338,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_20._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_20._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_20._M_string_length = (size_type)_Var7._M_p;
        shaderSource_20.field_2._M_allocated_capacity = sVar8;
        shaderSource_20.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_338[0],shaderSource_20);
        if (local_338[0] != local_328) {
          operator_delete(local_338[0],local_328[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        if (lVar6 != 8) {
          DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar6);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_358[0] = local_348;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_358,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_21._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_21._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_21._M_string_length = (size_type)_Var7._M_p;
          shaderSource_21.field_2._M_allocated_capacity = sVar8;
          shaderSource_21.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_358[0],shaderSource_21);
          if (local_358[0] != local_348) {
            operator_delete(local_358[0],local_348[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_378[0] = local_368;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_378,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_22._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_22._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_22._M_string_length = (size_type)_Var7._M_p;
          shaderSource_22.field_2._M_allocated_capacity = sVar8;
          shaderSource_22.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_378[0],shaderSource_22);
          if (local_378[0] != local_368) {
            operator_delete(local_378[0],local_368[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbf8);
          local_398[0] = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,_Var7._M_p,_Var7._M_p + sVar8);
          shaderSource_23._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
          shaderSource_23._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
          shaderSource_23._M_string_length = (size_type)_Var7._M_p;
          shaderSource_23.field_2._M_allocated_capacity = sVar8;
          shaderSource_23.field_2._8_8_ = uVar9;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_398[0],shaderSource_23);
          if (local_398[0] != local_388) {
            operator_delete(local_398[0],local_388[0] + 1);
          }
          if (_Var7._M_p != &stack0xfffffffffffffc10) {
            operator_delete(_Var7._M_p,uVar9 + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_3b8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_24._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_24._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_24._M_string_length = (size_type)_Var7._M_p;
        shaderSource_24.field_2._M_allocated_capacity = sVar8;
        shaderSource_24.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3b8[0],shaderSource_24);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_3d8[0] = local_3c8;
        std::__cxx11::string::_M_construct<char*>((string *)local_3d8,_Var7._M_p,_Var7._M_p + sVar8)
        ;
        shaderSource_25._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_25._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_25._M_string_length = (size_type)_Var7._M_p;
        shaderSource_25.field_2._M_allocated_capacity = sVar8;
        shaderSource_25.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3d8[0],shaderSource_25);
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  ((string *)&stack0xfffffffffffffc00,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbf8);
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_b8,_Var7._M_p,_Var7._M_p + sVar8);
        shaderSource_26._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffbfc;
        shaderSource_26._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffbf8;
        shaderSource_26._M_string_length = (size_type)_Var7._M_p;
        shaderSource_26.field_2._M_allocated_capacity = sVar8;
        shaderSource_26.field_2._8_8_ = uVar9;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b8[0],shaderSource_26);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if (_Var7._M_p != &stack0xfffffffffffffc10) {
          operator_delete(_Var7._M_p,uVar9 + 1);
        }
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar6 = local_78;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texel_fetch_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid P type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC2)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_BUFFER
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC3)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}